

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_ranges_suite.cpp
# Opt level: O0

void swap_array_partial(void)

{
  bool bVar1;
  iterator *piVar2;
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar3;
  char *pcVar4;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_968;
  basic_variable<std::allocator<char>_> *local_950;
  basic_variable<std::allocator<char>_> *local_910;
  basic_variable<std::allocator<char>_> *local_8f8;
  iterator local_8e8;
  iterator local_8d0;
  iterator local_8b8;
  iterator local_8a0;
  nullable local_884;
  basic_variable<std::allocator<char>_> *local_880;
  basic_variable<std::allocator<char>_> local_878;
  basic_variable<std::allocator<char>_> local_848;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  basic_variable<std::allocator<char>_> local_7b8;
  basic_variable<std::allocator<char>_> local_788;
  basic_variable<std::allocator<char>_> local_758;
  basic_variable<std::allocator<char>_> local_728;
  undefined1 local_6f8 [24];
  variable expect_1;
  iterator local_6a8;
  iterator local_690;
  iterator local_678;
  iterator local_660;
  nullable local_644;
  basic_variable<std::allocator<char>_> *local_640;
  basic_variable<std::allocator<char>_> local_638;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  basic_variable<std::allocator<char>_> local_578;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 local_4b8 [24];
  variable expect;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_460;
  iterator local_448;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_430;
  iterator local_418;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_400;
  iterator local_3e8;
  undefined1 local_3d0 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_3a8;
  basic_variable<std::allocator<char>_> local_378;
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  variable other;
  nullable local_1d4;
  basic_variable<std::allocator<char>_> *local_1d0;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_1d0 = &local_1c8;
  local_1d4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,&local_1d4);
  local_1d0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1d0,true);
  local_1d0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,2);
  local_1d0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1d0,3.0);
  local_1d0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,"alpha");
  local_1d0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"bravo");
  local_1d0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"charlie");
  local_1d0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"delta");
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 8;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar3 = &local_1c8;
  local_8f8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_8f8 = local_8f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8f8);
  } while (local_8f8 != pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_378,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_348,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_2e8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2b8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_288,true);
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_258,
             (nullable *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  local_228._0_8_ = &local_3a8;
  local_228._8_8_ = 8;
  init_00._M_len = (size_type)pbVar3;
  init_00._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_218,
             (basic_array<std::allocator<char>_> *)local_228._0_8_,init_00);
  local_910 = (basic_variable<std::allocator<char>_> *)local_228;
  do {
    local_910 = local_910 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_910);
  } while (local_910 != &local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&local_400,(basic_variable<std::allocator<char>_> *)local_38);
  piVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator++(&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator(&local_3e8,piVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&local_430,(basic_variable<std::allocator<char>_> *)local_38);
  piVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator--(&local_430);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator(&local_418,piVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)&local_460,(basic_variable<std::allocator<char>_> *)local_218);
  piVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator++(&local_460);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator(&local_448,piVar2);
  std::
  swap_ranges<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_3d0,&local_3e8,&local_418,&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&local_460)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&local_430)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&local_400)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&expect.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)local_218);
  piVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)&expect.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_3d0,piVar2);
  boost::detail::test_impl
            ("where == --other.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x29c,"void swap_array_partial()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)&expect.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_38);
  pcVar4 = "void swap_array_partial()";
  boost::detail::test_impl
            ("data.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x29e,"void swap_array_partial()",bVar1);
  local_640 = &local_638;
  local_644 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_640,&local_644);
  local_640 = &local_608;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_640,L"charlie");
  local_640 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_640,L"bravo");
  local_640 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_640,"alpha");
  local_640 = &local_578;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_640,3.0);
  local_640 = &local_548;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_640,2);
  local_640 = &local_518;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_640,true);
  local_640 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_640,L"delta");
  local_4b8._0_8_ = &local_638;
  local_4b8._8_8_ = 8;
  init_01._M_len = (size_type)pcVar4;
  init_01._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_4b8._0_8_,init_01);
  local_950 = (basic_variable<std::allocator<char>_> *)local_4b8;
  do {
    local_950 = local_950 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_950);
  } while (local_950 != &local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_660,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_678,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_690,(basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6a8,(basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x2a2,"void swap_array_partial()",&local_660,&local_678,&local_690,&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_690);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_660);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_4b8 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_218);
  pcVar4 = "void swap_array_partial()";
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x2a5,"void swap_array_partial()",bVar1);
  local_880 = &local_878;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_880,L"delta");
  local_880 = &local_848;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_880,true);
  local_880 = &local_818;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_880,2);
  local_880 = &local_7e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_880,3.0);
  local_880 = &local_7b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_880,"alpha");
  local_880 = &local_788;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_880,L"bravo");
  local_880 = &local_758;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_880,L"charlie");
  local_880 = &local_728;
  local_884 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_880,&local_884);
  local_6f8._0_8_ = &local_878;
  local_6f8._8_8_ = 8;
  init_02._M_len = (size_type)pcVar4;
  init_02._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6f8._0_8_,init_02);
  local_968 = (basic_variable<std::allocator<char>_> *)local_6f8;
  do {
    local_968 = local_968 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_968);
  } while (local_968 != &local_878);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8a0,(basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8b8,(basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8d0,(basic_variable<std::allocator<char>_> *)(local_6f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8e8,(basic_variable<std::allocator<char>_> *)(local_6f8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x2a9,"void swap_array_partial()",&local_8a0,&local_8b8,&local_8d0,&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6f8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void swap_array_partial()
{
    variable data = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    variable other = array::make({ U"delta", u"charlie", L"bravo", "alpha", 3.0, 2, true, null });
    auto where = std::swap_ranges(++data.begin(), --data.end(), ++other.begin());
    TRIAL_PROTOCOL_TEST(where == --other.end());
    {
        TRIAL_PROTOCOL_TEST(data.is<array>());
        variable expect = array::make({ null, u"charlie", L"bravo", "alpha", 3.0, 2, true, U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        TRIAL_PROTOCOL_TEST(other.is<array>());
        variable expect = array::make({ U"delta", true, 2, 3.0, "alpha", L"bravo", u"charlie", null });
        TRIAL_PROTOCOL_TEST_ALL_WITH(other.begin(), other.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}